

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O0

vector<Tetris,_std::allocator<Tetris>_> * __thiscall
GameBoard::getPlaces
          (GameBoard *this,int id,int blockType,vector<Tetris,_std::allocator<Tetris>_> *ans,
          bool unique)

{
  int iVar1;
  code *pcVar2;
  undefined1 uVar3;
  bool bVar4;
  uint uVar5;
  int *piVar6;
  reference this_00;
  int in_EDX;
  int in_ESI;
  GameBoard *in_RDI;
  byte in_R8B;
  int o2;
  value_type *fr;
  int y;
  int xo;
  int o;
  int i;
  bool hv;
  int mh;
  Tetris tmp;
  queue<Tetris,_std::deque<Tetris,_std::allocator<Tetris>_>_> q;
  undefined4 in_stack_fffffffffffffef8;
  undefined1 in_stack_fffffffffffffefc;
  undefined1 in_stack_fffffffffffffefd;
  undefined1 in_stack_fffffffffffffefe;
  undefined1 in_stack_fffffffffffffeff;
  queue<Tetris,_std::deque<Tetris,_std::allocator<Tetris>_>_> *in_stack_ffffffffffffff00;
  undefined6 in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff0f;
  Tetris *in_stack_ffffffffffffff10;
  byte local_d9;
  int local_c0;
  int local_bc;
  int local_b8;
  int local_b4;
  int local_b0;
  byte local_a9;
  int local_a8;
  Tetris local_98 [3];
  byte local_19;
  int local_10;
  int local_c;
  
  local_19 = in_R8B & 1;
  local_10 = in_EDX;
  local_c = in_ESI;
  std::queue<Tetris,std::deque<Tetris,std::allocator<Tetris>>>::
  queue<std::deque<Tetris,std::allocator<Tetris>>,void>(in_stack_ffffffffffffff00);
  memset(getPlaces::vis,0,0x420);
  Tetris::Tetris(local_98,in_RDI,local_10,local_c);
  local_a8 = 0x14;
  while( true ) {
    local_a9 = 0;
    local_b0 = 1;
    while( true ) {
      local_d9 = 0;
      if (local_b0 < 0xb) {
        local_d9 = local_a9 ^ 0xff;
      }
      if ((local_d9 & 1) == 0) break;
      if (in_RDI->gridInfo[local_c][local_a8][local_b0] != 0) {
        local_a9 = 1;
      }
      local_b0 = local_b0 + 1;
    }
    if (local_a9 != 0) break;
    local_a8 = local_a8 + -1;
  }
  for (local_b4 = 0; local_b4 < 4; local_b4 = local_b4 + 1) {
    local_b8 = (blockHalfHeight[local_10][local_b4] - blockHeight[local_10][local_b4]) + 0x15;
    local_bc = local_a8 + 1 + blockHeight[local_10][local_b4];
    piVar6 = std::min<int>(&local_b8,&local_bc);
    local_b8 = *piVar6;
    for (local_c0 = 1; local_c0 < 0xb; local_c0 = local_c0 + 1) {
      in_stack_ffffffffffffff10 = Tetris::set(local_98,local_b8,local_c0,local_b4);
      in_stack_ffffffffffffff0f = Tetris::isValid(in_stack_ffffffffffffff10,-1,-1,-1);
      if ((bool)in_stack_ffffffffffffff0f) {
        std::queue<Tetris,_std::deque<Tetris,_std::allocator<Tetris>_>_>::push
                  (in_stack_ffffffffffffff00,
                   (value_type *)
                   CONCAT17(in_stack_fffffffffffffeff,
                            CONCAT16(in_stack_fffffffffffffefe,
                                     CONCAT15(in_stack_fffffffffffffefd,
                                              CONCAT14(in_stack_fffffffffffffefc,
                                                       in_stack_fffffffffffffef8)))));
        getPlaces::vis[local_98[0].blockX][local_98[0].blockY][local_98[0].orientation] = true;
      }
    }
  }
  while (uVar3 = std::queue<Tetris,_std::deque<Tetris,_std::allocator<Tetris>_>_>::empty
                           ((queue<Tetris,_std::deque<Tetris,_std::allocator<Tetris>_>_> *)0x13f5d3)
        , ((uVar3 ^ 0xff) & 1) != 0) {
    this_00 = std::queue<Tetris,_std::deque<Tetris,_std::allocator<Tetris>_>_>::front
                        ((queue<Tetris,_std::deque<Tetris,_std::allocator<Tetris>_>_> *)0x13f5f5);
    Tetris::set(local_98,this_00->blockX,this_00->blockY,this_00->orientation);
    std::queue<Tetris,_std::deque<Tetris,_std::allocator<Tetris>_>_>::pop
              ((queue<Tetris,_std::deque<Tetris,_std::allocator<Tetris>_>_> *)0x13f62d);
    in_stack_fffffffffffffeff =
         Tetris::onGround((Tetris *)
                          CONCAT17(in_stack_fffffffffffffeff,
                                   CONCAT16(in_stack_fffffffffffffefe,
                                            CONCAT15(in_stack_fffffffffffffefd,
                                                     CONCAT14(in_stack_fffffffffffffefc,
                                                              in_stack_fffffffffffffef8)))));
    if ((bool)in_stack_fffffffffffffeff) {
      std::vector<Tetris,_std::allocator<Tetris>_>::push_back
                ((vector<Tetris,_std::allocator<Tetris>_> *)in_stack_ffffffffffffff10,
                 (value_type *)
                 CONCAT17(in_stack_ffffffffffffff0f,CONCAT16(uVar3,in_stack_ffffffffffffff08)));
    }
    local_98[0].blockY = local_98[0].blockY + 1;
    if (((getPlaces::vis[local_98[0].blockX][local_98[0].blockY][local_98[0].orientation] & 1U) == 0
        ) && (in_stack_fffffffffffffefe = Tetris::isValid(local_98,-1,-1,-1),
             (bool)in_stack_fffffffffffffefe)) {
      std::queue<Tetris,_std::deque<Tetris,_std::allocator<Tetris>_>_>::push
                ((queue<Tetris,_std::deque<Tetris,_std::allocator<Tetris>_>_> *)this_00,
                 (value_type *)
                 CONCAT17(in_stack_fffffffffffffeff,
                          CONCAT16(in_stack_fffffffffffffefe,
                                   CONCAT15(in_stack_fffffffffffffefd,
                                            CONCAT14(in_stack_fffffffffffffefc,
                                                     in_stack_fffffffffffffef8)))));
      getPlaces::vis[local_98[0].blockX][local_98[0].blockY][local_98[0].orientation] = true;
    }
    local_98[0].blockY = local_98[0].blockY + -2;
    if (((getPlaces::vis[local_98[0].blockX][local_98[0].blockY][local_98[0].orientation] & 1U) == 0
        ) && (in_stack_fffffffffffffefd = Tetris::isValid(local_98,-1,-1,-1),
             (bool)in_stack_fffffffffffffefd)) {
      std::queue<Tetris,_std::deque<Tetris,_std::allocator<Tetris>_>_>::push
                ((queue<Tetris,_std::deque<Tetris,_std::allocator<Tetris>_>_> *)this_00,
                 (value_type *)
                 CONCAT17(in_stack_fffffffffffffeff,
                          CONCAT16(in_stack_fffffffffffffefe,
                                   CONCAT15(in_stack_fffffffffffffefd,
                                            CONCAT14(in_stack_fffffffffffffefc,
                                                     in_stack_fffffffffffffef8)))));
      getPlaces::vis[local_98[0].blockX][local_98[0].blockY][local_98[0].orientation] = true;
    }
    local_98[0].blockY = local_98[0].blockY + 1;
    local_98[0].blockX = local_98[0].blockX + -1;
    if (((getPlaces::vis[local_98[0].blockX][local_98[0].blockY][local_98[0].orientation] & 1U) == 0
        ) && (in_stack_fffffffffffffefc = Tetris::isValid(local_98,-1,-1,-1),
             (bool)in_stack_fffffffffffffefc)) {
      std::queue<Tetris,_std::deque<Tetris,_std::allocator<Tetris>_>_>::push
                ((queue<Tetris,_std::deque<Tetris,_std::allocator<Tetris>_>_> *)this_00,
                 (value_type *)
                 CONCAT17(in_stack_fffffffffffffeff,
                          CONCAT16(in_stack_fffffffffffffefe,
                                   CONCAT15(in_stack_fffffffffffffefd,
                                            CONCAT14(in_stack_fffffffffffffefc,
                                                     in_stack_fffffffffffffef8)))));
      getPlaces::vis[local_98[0].blockX][local_98[0].blockY][local_98[0].orientation] = true;
    }
    local_98[0].blockX = local_98[0].blockX + 1;
    if (local_10 != 6) {
      uVar5 = local_98[0].orientation + 1U;
      if ((int)(local_98[0].orientation + 1U) < 0) {
        uVar5 = local_98[0].orientation + 4;
      }
      iVar1 = (local_98[0].orientation + 1) - (uVar5 & 0xfffffffc);
      bVar4 = Tetris::rotation((Tetris *)
                               CONCAT17(in_stack_ffffffffffffff0f,
                                        CONCAT16(uVar3,in_stack_ffffffffffffff08)),
                               (int)((ulong)this_00 >> 0x20));
      in_stack_fffffffffffffef8 = CONCAT13(bVar4,(int3)in_stack_fffffffffffffef8);
      if ((bVar4) && ((getPlaces::vis[local_98[0].blockX][local_98[0].blockY][iVar1] & 1U) == 0)) {
        local_98[0].orientation = iVar1;
        std::queue<Tetris,_std::deque<Tetris,_std::allocator<Tetris>_>_>::push
                  ((queue<Tetris,_std::deque<Tetris,_std::allocator<Tetris>_>_> *)this_00,
                   (value_type *)
                   CONCAT17(in_stack_fffffffffffffeff,
                            CONCAT16(in_stack_fffffffffffffefe,
                                     CONCAT15(in_stack_fffffffffffffefd,
                                              CONCAT14(in_stack_fffffffffffffefc,
                                                       in_stack_fffffffffffffef8)))));
        getPlaces::vis[local_98[0].blockX][local_98[0].blockY][local_98[0].orientation] = true;
      }
    }
  }
  pcVar2 = (code *)invalidInstructionException();
  (*pcVar2)();
}

Assistant:

vector<Tetris> &GameBoard::getPlaces(int id, int blockType, vector<Tetris> &ans, bool unique)
{
    queue<Tetris> q;
    static bool vis[MAPHEIGHT + 2][MAPWIDTH + 2][4];
    memset(vis, 0, sizeof(vis));
    Tetris tmp(this, blockType, id);
    int mh = MAPHEIGHT;
    while (1) {
        bool hv = false;
        for (int i = 1; i <= MAPWIDTH && !hv; ++i)
            if (gridInfo[id][mh][i] != 0)
                hv = true;
        if (hv)
            break;
        --mh;
    }
    for (int o = 0; o < 4; ++o) {
        int xo = MAPHEIGHT + blockHalfHeight[blockType][o] - blockHeight[blockType][o] + 1;
        xo = min(xo, mh + blockHeight[blockType][o] + 1);
        for (int y = 1; y <= MAPWIDTH; ++y)
            if (tmp.set(xo, y, o).isValid()) {
                q.push(tmp);
                vis[tmp.blockX][tmp.blockY][tmp.orientation] = true;
            }
    }
    //vector<Tetris> ans;
    while (!q.empty()) {
        auto &fr = q.front();
        tmp.set(fr.blockX, fr.blockY, fr.orientation);
        q.pop();
        if (tmp.onGround())
            ans.push_back(tmp);
        ++tmp.blockY;
        if (!vis[tmp.blockX][tmp.blockY][tmp.orientation] && tmp.isValid()) {
            q.push(tmp);
            vis[tmp.blockX][tmp.blockY][tmp.orientation] = true;
        }
        --tmp.blockY, --tmp.blockY;
        if (!vis[tmp.blockX][tmp.blockY][tmp.orientation] && tmp.isValid()) {
            q.push(tmp);
            vis[tmp.blockX][tmp.blockY][tmp.orientation] = true;
        }
        ++tmp.blockY, --tmp.blockX;
        if (!vis[tmp.blockX][tmp.blockY][tmp.orientation] && tmp.isValid()) {
            q.push(tmp);
            vis[tmp.blockX][tmp.blockY][tmp.orientation] = true;
        }
        ++tmp.blockX;
        if (blockType != 6) {
            int o2 = (tmp.orientation + 1) % 4;
            if (tmp.rotation(o2) && !vis[tmp.blockX][tmp.blockY][o2]) {
                tmp.orientation = o2;
                q.push(tmp);
                vis[tmp.blockX][tmp.blockY][tmp.orientation] = true;
            }
        }
    }
    /*if (!unique)
        return _ans = ans;
    _ans.clear();
    for (auto &i : ans) {
        bool hit = false;
        for (auto &t : _ans)
            if (i.same(t)) {
                hit = true;
                break;
            }
        if (!hit)
            _ans.push_back(i);
    }
    return _ans;*/
}